

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_soup_mesh_builder.cc
# Opt level: O0

void __thiscall
draco::TriangleSoupMeshBuilder::SetPerFaceAttributeValueForFace
          (TriangleSoupMeshBuilder *this,int att_id,FaceIndex face_id,void *value)

{
  reference pvVar1;
  int in_ESI;
  vector<signed_char,_std::allocator<signed_char>_> *in_RDI;
  int8_t *element_type;
  PointAttribute *att;
  int start_index;
  undefined8 in_stack_ffffffffffffff78;
  int32_t att_id_00;
  PointCloud *in_stack_ffffffffffffff80;
  Mesh *in_stack_ffffffffffffffa8;
  FaceIndex in_stack_ffffffffffffffb4;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> IStack_48;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> aIStack_44 [2];
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_3c;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_38;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_34;
  PointAttribute *local_30;
  uint local_24;
  int local_14;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_4;
  
  att_id_00 = (int32_t)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  local_14 = in_ESI;
  local_24 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::value(&local_4);
  local_24 = local_24 * 3;
  std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::operator->
            ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)0x193908);
  local_30 = PointCloud::attribute(in_stack_ffffffffffffff80,att_id_00);
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_34,local_24);
  GeometryAttribute::SetAttributeValue
            ((GeometryAttribute *)in_stack_ffffffffffffffa8,
             (AttributeValueIndex)in_stack_ffffffffffffffb4.value_,in_RDI);
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_38,local_24 + 1);
  GeometryAttribute::SetAttributeValue
            ((GeometryAttribute *)in_stack_ffffffffffffffa8,
             (AttributeValueIndex)in_stack_ffffffffffffffb4.value_,in_RDI);
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_3c,local_24 + 2);
  GeometryAttribute::SetAttributeValue
            ((GeometryAttribute *)in_stack_ffffffffffffffa8,
             (AttributeValueIndex)in_stack_ffffffffffffffb4.value_,in_RDI);
  std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::operator->
            ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)0x1939ac);
  IndexType<unsigned_int,_draco::PointIndex_tag_type_>::IndexType
            ((IndexType<unsigned_int,_draco::PointIndex_tag_type_> *)&stack0xffffffffffffffb4,
             local_24);
  IndexType<unsigned_int,_draco::PointIndex_tag_type_>::IndexType(&IStack_48,local_24 + 1);
  IndexType<unsigned_int,_draco::PointIndex_tag_type_>::IndexType(aIStack_44,local_24 + 2);
  Mesh::SetFace(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb4,(Face *)in_RDI);
  pvVar1 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[](in_RDI,(long)local_14)
  ;
  if (*pvVar1 < '\0') {
    *pvVar1 = '\x02';
  }
  return;
}

Assistant:

void TriangleSoupMeshBuilder::SetPerFaceAttributeValueForFace(
    int att_id, FaceIndex face_id, const void *value) {
  const int start_index = 3 * face_id.value();
  PointAttribute *const att = mesh_->attribute(att_id);
  att->SetAttributeValue(AttributeValueIndex(start_index), value);
  att->SetAttributeValue(AttributeValueIndex(start_index + 1), value);
  att->SetAttributeValue(AttributeValueIndex(start_index + 2), value);
  mesh_->SetFace(face_id,
                 {{PointIndex(start_index), PointIndex(start_index + 1),
                   PointIndex(start_index + 2)}});
  int8_t &element_type = attribute_element_types_[att_id];
  if (element_type < 0) {
    element_type = MESH_FACE_ATTRIBUTE;
  }
}